

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O2

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N,char *Name,_Bool *Valid)

{
  char *__s1;
  int iVar1;
  char *__s2;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    if (N->NumPairs <= uVar3) {
      *Valid = false;
      return 0xffffffff;
    }
    __s1 = N->Pairs[uVar3].Name;
    __s2 = cs_strdup(Name);
    for (pcVar4 = __s2; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
      iVar1 = tolower((int)*pcVar4);
      *pcVar4 = (char)iVar1;
    }
    iVar1 = strcmp(__s1,__s2);
    (*cs_mem_free)(__s2);
    uVar2 = uVar2 + 1;
  } while (iVar1 != 0);
  *Valid = true;
  return N->Pairs[uVar3].Value;
}

Assistant:

uint32_t A64NamedImmMapper_fromString(const A64NamedImmMapper *N, char *Name, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (compare_lower_str(N->Pairs[i].Name, Name)) {
			*Valid = true;
			return N->Pairs[i].Value;
		}
	}

	*Valid = false;
	return (uint32_t)-1;
}